

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmJsonDecode(json_decoder *pDecoder,jx9_value *pArrayKey)

{
  ProcJSONConsumer p_Var1;
  void *pvVar2;
  int iVar3;
  sxi32 sVar4;
  jx9_value *pWorker_00;
  bool bVar5;
  SyString *pStr_2;
  void *pOld_1;
  jx9_value *pKey;
  ProcJSONConsumer xOld_1;
  void *pOld;
  ProcJSONConsumer xOld;
  SyString *pStr_1;
  SyString *pStr;
  jx9_value *pjStack_28;
  sxi32 rc;
  jx9_value *pWorker;
  jx9_value *pArrayKey_local;
  json_decoder *pDecoder_local;
  
  if (pDecoder->rec_count < 0x20) {
    if ((pDecoder->pIn->nType & 0x81f) == 0) {
      if ((pDecoder->pIn->nType & 0x80) == 0) {
        if ((pDecoder->pIn->nType & 0x20) == 0) {
          pDecoder_local._4_4_ = -10;
        }
        else {
          pDecoder->pIn = pDecoder->pIn + 1;
          pjStack_28 = jx9_context_new_array(pDecoder->pCtx);
          pWorker_00 = jx9_context_new_scalar(pDecoder->pCtx);
          if ((pjStack_28 == (jx9_value *)0x0) || (pWorker_00 == (jx9_value *)0x0)) {
            jx9_context_throw_error(pDecoder->pCtx,1,"JX9 is running out of memory");
            pDecoder_local._4_4_ = -10;
          }
          else {
            p_Var1 = pDecoder->xConsumer;
            pvVar2 = pDecoder->pUserData;
            pDecoder->xConsumer = VmJsonArrayDecoder;
            pDecoder->pUserData = pjStack_28;
            while( true ) {
              while( true ) {
                bVar5 = false;
                if (pDecoder->pIn < pDecoder->pEnd) {
                  bVar5 = (pDecoder->pIn->nType & 0x400) != 0;
                }
                if (!bVar5) break;
                pDecoder->pIn = pDecoder->pIn + 1;
              }
              if ((pDecoder->pEnd <= pDecoder->pIn) || ((pDecoder->pIn->nType & 0x40) != 0)) {
                if (pDecoder->pIn < pDecoder->pEnd) {
                  pDecoder->pIn = pDecoder->pIn + 1;
                }
                pDecoder->xConsumer = p_Var1;
                pDecoder->pUserData = pvVar2;
                (*p_Var1)(pDecoder->pCtx,pArrayKey,pjStack_28,pvVar2);
                jx9_context_release_value(pDecoder->pCtx,pWorker_00);
                goto LAB_00142cbf;
              }
              if ((((pDecoder->pIn->nType & 0x804) == 0) || (pDecoder->pEnd <= pDecoder->pIn + 1))
                 || ((pDecoder->pIn[1].nType & 0x200) == 0)) {
                *pDecoder->pErr = -0xc;
                return -10;
              }
              if ((pDecoder->pIn->nType & 0x800) == 0) {
                VmJsonDequoteString(&pDecoder->pIn->sData,pWorker_00);
              }
              else {
                jx9_value_string(pWorker_00,(pDecoder->pIn->sData).zString,
                                 (pDecoder->pIn->sData).nByte);
              }
              pDecoder->pIn = pDecoder->pIn + 2;
              pDecoder->rec_count = pDecoder->rec_count + 1;
              sVar4 = VmJsonDecode(pDecoder,pWorker_00);
              pDecoder->rec_count = pDecoder->rec_count + -1;
              if (sVar4 == -10) break;
              jx9_value_reset_string_cursor(pWorker_00);
            }
            pDecoder_local._4_4_ = -10;
          }
        }
      }
      else {
        pDecoder->pIn = pDecoder->pIn + 1;
        pjStack_28 = jx9_context_new_array(pDecoder->pCtx);
        if (pjStack_28 == (jx9_value *)0x0) {
          jx9_context_throw_error(pDecoder->pCtx,1,"JX9 is running out of memory");
          pDecoder_local._4_4_ = -10;
        }
        else {
          p_Var1 = pDecoder->xConsumer;
          pvVar2 = pDecoder->pUserData;
          pDecoder->xConsumer = VmJsonArrayDecoder;
          pDecoder->pUserData = pjStack_28;
          do {
            while( true ) {
              bVar5 = false;
              if (pDecoder->pIn < pDecoder->pEnd) {
                bVar5 = (pDecoder->pIn->nType & 0x400) != 0;
              }
              if (!bVar5) break;
              pDecoder->pIn = pDecoder->pIn + 1;
            }
            if ((pDecoder->pEnd <= pDecoder->pIn) || ((pDecoder->pIn->nType & 0x100) != 0)) {
              if (pDecoder->pIn < pDecoder->pEnd) {
                pDecoder->pIn = pDecoder->pIn + 1;
              }
              pDecoder->xConsumer = p_Var1;
              pDecoder->pUserData = pvVar2;
              (*p_Var1)(pDecoder->pCtx,pArrayKey,pjStack_28,pvVar2);
              goto LAB_00142cbf;
            }
            pDecoder->rec_count = pDecoder->rec_count + 1;
            sVar4 = VmJsonDecode(pDecoder,(jx9_value *)0x0);
            pDecoder->rec_count = pDecoder->rec_count + -1;
            if (sVar4 == -10) {
              return -10;
            }
          } while ((pDecoder->pEnd <= pDecoder->pIn) || ((pDecoder->pIn->nType & 0x500) != 0));
          *pDecoder->pErr = -0xc;
          pDecoder_local._4_4_ = -10;
        }
      }
    }
    else {
      pjStack_28 = jx9_context_new_scalar(pDecoder->pCtx);
      if (pjStack_28 == (jx9_value *)0x0) {
        jx9_context_throw_error(pDecoder->pCtx,1,"JX9 is running out of memory");
        pDecoder_local._4_4_ = -10;
      }
      else {
        if ((pDecoder->pIn->nType & 8) == 0) {
          if ((pDecoder->pIn->nType & 3) == 0) {
            if ((pDecoder->pIn->nType & 0x10) == 0) {
              if ((pDecoder->pIn->nType & 0x800) == 0) {
                VmJsonDequoteString(&pDecoder->pIn->sData,pjStack_28);
              }
              else {
                jx9_value_string(pjStack_28,(pDecoder->pIn->sData).zString,
                                 (pDecoder->pIn->sData).nByte);
              }
            }
            else {
              jx9_value_string(pjStack_28,(pDecoder->pIn->sData).zString,
                               (pDecoder->pIn->sData).nByte);
              jx9MemObjToNumeric(pjStack_28);
            }
          }
          else {
            jx9_value_bool(pjStack_28,(uint)((pDecoder->pIn->nType & 1) != 0));
          }
        }
        else {
          jx9_value_null(pjStack_28);
        }
        iVar3 = (*pDecoder->xConsumer)(pDecoder->pCtx,pArrayKey,pjStack_28,pDecoder->pUserData);
        if (iVar3 == -10) {
          pDecoder_local._4_4_ = -10;
        }
        else {
          pDecoder->pIn = pDecoder->pIn + 1;
LAB_00142cbf:
          jx9_context_release_value(pDecoder->pCtx,pjStack_28);
          pDecoder_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    pDecoder_local._4_4_ = -10;
  }
  return pDecoder_local._4_4_;
}

Assistant:

static sxi32 VmJsonDecode(
	json_decoder *pDecoder, /* JSON decoder */      
	jx9_value *pArrayKey    /* Key for the decoded array */
	){
	jx9_value *pWorker; /* Worker variable */
	sxi32 rc;
	/* Check if we do not nest to much */
	if( pDecoder->rec_count > 31 ){
		/* Nesting limit reached, abort decoding immediately */
		return SXERR_ABORT;
	}
	if( pDecoder->pIn->nType & (JSON_TK_STR|JSON_TK_ID|JSON_TK_TRUE|JSON_TK_FALSE|JSON_TK_NULL|JSON_TK_NUM) ){
		/* Scalar value */
		pWorker = jx9_context_new_scalar(pDecoder->pCtx);
		if( pWorker == 0 ){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Reflect the JSON image */
		if( pDecoder->pIn->nType & JSON_TK_NULL ){
			/* Nullify the value.*/
			jx9_value_null(pWorker);
		}else if( pDecoder->pIn->nType & (JSON_TK_TRUE|JSON_TK_FALSE) ){
			/* Boolean value */
			jx9_value_bool(pWorker, (pDecoder->pIn->nType & JSON_TK_TRUE) ? 1 : 0 );
		}else if( pDecoder->pIn->nType & JSON_TK_NUM ){
			SyString *pStr = &pDecoder->pIn->sData;
			/* 
			 * Numeric value.
			 * Get a string representation first then try to get a numeric
			 * value.
			 */
			jx9_value_string(pWorker, pStr->zString, (int)pStr->nByte);
			/* Obtain a numeric representation */
			jx9MemObjToNumeric(pWorker);
		}else if( pDecoder->pIn->nType & JSON_TK_ID ){
			SyString *pStr = &pDecoder->pIn->sData;
			jx9_value_string(pWorker, pStr->zString, (int)pStr->nByte);
		}else{
			/* Dequote the string */
			VmJsonDequoteString(&pDecoder->pIn->sData, pWorker);
		}
		/* Invoke the consumer callback */
		rc = pDecoder->xConsumer(pDecoder->pCtx, pArrayKey, pWorker, pDecoder->pUserData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		/* All done, advance the stream cursor */
		pDecoder->pIn++;
	}else if( pDecoder->pIn->nType & JSON_TK_OSB /*'[' */) {
		ProcJSONConsumer xOld;
		void *pOld;
		/* Array representation*/
		pDecoder->pIn++;
		/* Create a working array */
		pWorker = jx9_context_new_array(pDecoder->pCtx);
		if( pWorker == 0 ){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Save the old consumer */
		xOld = pDecoder->xConsumer;
		pOld = pDecoder->pUserData;
		/* Set the new consumer */
		pDecoder->xConsumer = VmJsonArrayDecoder;
		pDecoder->pUserData = pWorker;
		/* Decode the array */
		for(;;){
			/* Jump trailing comma. Note that the standard JX9 engine will not let you
			 * do this.
			 */
			while( (pDecoder->pIn < pDecoder->pEnd) && (pDecoder->pIn->nType & JSON_TK_COMMA) ){
				pDecoder->pIn++;
			}
			if( pDecoder->pIn >= pDecoder->pEnd || (pDecoder->pIn->nType & JSON_TK_CSB) /*']'*/ ){
				if( pDecoder->pIn < pDecoder->pEnd ){
					pDecoder->pIn++; /* Jump the trailing ']' */
				}
				break;
			}
			/* Recurse and decode the entry */
			pDecoder->rec_count++;
			rc = VmJsonDecode(pDecoder, 0);
			pDecoder->rec_count--;
			if( rc == SXERR_ABORT ){
				/* Abort processing immediately */
				return SXERR_ABORT;
			}
			/*The cursor is automatically advanced by the VmJsonDecode() function */
			if( (pDecoder->pIn < pDecoder->pEnd) &&
				((pDecoder->pIn->nType & (JSON_TK_CSB/*']'*/|JSON_TK_COMMA/*','*/))==0) ){
					/* Unexpected token, abort immediatley */
					*pDecoder->pErr = SXERR_SYNTAX;
					return SXERR_ABORT;
			}
		}
		/* Restore the old consumer */
		pDecoder->xConsumer = xOld;
		pDecoder->pUserData = pOld;
		/* Invoke the old consumer on the decoded array */
		xOld(pDecoder->pCtx, pArrayKey, pWorker, pOld);
	}else if( pDecoder->pIn->nType & JSON_TK_OCB /*'{' */) {
		ProcJSONConsumer xOld;
		jx9_value *pKey;
		void *pOld;
		/* Object representation*/
		pDecoder->pIn++;
		/* Create a working array */
		pWorker = jx9_context_new_array(pDecoder->pCtx);
		pKey = jx9_context_new_scalar(pDecoder->pCtx);
		if( pWorker == 0 || pKey == 0){
			jx9_context_throw_error(pDecoder->pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			/* Abort the decoding operation immediately */
			return SXERR_ABORT;
		}
		/* Save the old consumer */
		xOld = pDecoder->xConsumer;
		pOld = pDecoder->pUserData;
		/* Set the new consumer */
		pDecoder->xConsumer = VmJsonArrayDecoder;
		pDecoder->pUserData = pWorker;
		/* Decode the object */
		for(;;){
			/* Jump trailing comma. Note that the standard JX9 engine will not let you
			 * do this.
			 */
			while( (pDecoder->pIn < pDecoder->pEnd) && (pDecoder->pIn->nType & JSON_TK_COMMA) ){
				pDecoder->pIn++;
			}
			if( pDecoder->pIn >= pDecoder->pEnd || (pDecoder->pIn->nType & JSON_TK_CCB) /*'}'*/ ){
				if( pDecoder->pIn < pDecoder->pEnd ){
					pDecoder->pIn++; /* Jump the trailing ']' */
				}
				break;
			}
			if( (pDecoder->pIn->nType & (JSON_TK_ID|JSON_TK_STR)) == 0 || &pDecoder->pIn[1] >= pDecoder->pEnd
				|| (pDecoder->pIn[1].nType & JSON_TK_COLON) == 0){
					/* Syntax error, return immediately */
					*pDecoder->pErr = SXERR_SYNTAX;
					return SXERR_ABORT;
			}
			if( pDecoder->pIn->nType & JSON_TK_ID ){
				SyString *pStr = &pDecoder->pIn->sData;
				jx9_value_string(pKey, pStr->zString, (int)pStr->nByte);
			}else{
				/* Dequote the key */
				VmJsonDequoteString(&pDecoder->pIn->sData, pKey);
			}
			/* Jump the key and the colon */
			pDecoder->pIn += 2; 
			/* Recurse and decode the value */
			pDecoder->rec_count++;
			rc = VmJsonDecode(pDecoder, pKey);
			pDecoder->rec_count--;
			if( rc == SXERR_ABORT ){
				/* Abort processing immediately */
				return SXERR_ABORT;
			}
			/* Reset the internal buffer of the key */
			jx9_value_reset_string_cursor(pKey);
			/*The cursor is automatically advanced by the VmJsonDecode() function */
		}
		/* Restore the old consumer */
		pDecoder->xConsumer = xOld;
		pDecoder->pUserData = pOld;
		/* Invoke the old consumer on the decoded object*/
		xOld(pDecoder->pCtx, pArrayKey, pWorker, pOld);
		/* Release the key */
		jx9_context_release_value(pDecoder->pCtx, pKey);
	}else{
		/* Unexpected token */
		return SXERR_ABORT; /* Abort immediately */
	}
	/* Release the worker variable */
	jx9_context_release_value(pDecoder->pCtx, pWorker);
	return SXRET_OK;
}